

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O1

void xmrig::cryptonight_double_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  long *plVar1;
  long *plVar2;
  ulong *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  cryptonight_ctx *input_00;
  cryptonight_ctx *input_01;
  __m128i *output_00;
  __m128i *output_01;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  uint8_t *hashval;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  double dVar64;
  ulong uVar65;
  ulong uVar66;
  
  input_00 = *ctx;
  keccak(input,(int)size,input_00->state,200);
  input_01 = ctx[1];
  keccak(input + size,(int)size,input_01->state,200);
  output_00 = (__m128i *)input_00->memory;
  output_01 = (__m128i *)input_01->memory;
  uVar45 = *(ulong *)((long)input_00->state + 0x60);
  lVar48 = *(long *)((long)input_00->state + 0x68);
  uVar49 = *(ulong *)((long)input_01->state + 0x60);
  lVar44 = *(long *)((long)input_01->state + 0x68);
  fesetround(0x400);
  cn_explode_scratchpad<true>((__m128i *)input_00,output_00);
  cn_explode_scratchpad<true>((__m128i *)input_01,output_01);
  uVar36 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  if (uVar36 != 0) {
    uVar62 = *(ulong *)((long)input_01->state + 0x20) ^ *(ulong *)input_01->state;
    uVar63 = *(ulong *)((long)input_01->state + 0x28) ^ *(longlong *)((long)input_01->state + 8);
    uVar60 = *(ulong *)((long)input_00->state + 0x20) ^ *(ulong *)input_00->state;
    uVar61 = *(ulong *)((long)input_00->state + 0x28) ^ *(longlong *)((long)input_00->state + 8);
    uVar57 = *(ulong *)((long)input_01->state + 0x30) ^ *(ulong *)((long)input_01->state + 0x10);
    uVar59 = *(ulong *)((long)input_01->state + 0x38) ^ *(ulong *)((long)input_01->state + 0x18);
    uVar54 = *(ulong *)((long)input_01->state + 0x40) ^ *(ulong *)((long)input_01->state + 0x50);
    uVar55 = *(ulong *)((long)input_01->state + 0x48) ^ *(ulong *)((long)input_01->state + 0x58);
    uVar51 = *(ulong *)((long)input_00->state + 0x30) ^ *(ulong *)((long)input_00->state + 0x10);
    uVar53 = *(ulong *)((long)input_00->state + 0x38) ^ *(ulong *)((long)input_00->state + 0x18);
    uVar34 = *(ulong *)((long)input_00->state + 0x40) ^ *(ulong *)((long)input_00->state + 0x50);
    uVar43 = *(ulong *)((long)input_00->state + 0x48) ^ *(ulong *)((long)input_00->state + 0x58);
    do {
      uVar52 = uVar53;
      uVar50 = uVar51;
      uVar58 = uVar59;
      uVar56 = uVar57;
      uVar37 = uVar60 & 0xffff0;
      uVar4 = *(uint *)((long)*output_00 + uVar37);
      uVar5 = *(uint *)((long)*output_00 + uVar37 + 4);
      uVar6 = *(uint *)((long)*output_00 + uVar37 + 8);
      uVar7 = *(uint *)((long)*output_00 + uVar37 + 0xc);
      uVar39 = uVar62 & 0xffff0;
      uVar8 = *(uint *)((long)*output_01 + uVar39);
      uVar9 = *(uint *)((long)*output_01 + uVar39 + 4);
      uVar10 = *(uint *)((long)*output_01 + uVar39 + 8);
      uVar11 = *(uint *)((long)*output_01 + uVar39 + 0xc);
      uVar12 = saes_table[1][uVar9 >> 8 & 0xff];
      uVar13 = saes_table[0][uVar8 & 0xff];
      uVar14 = saes_table[1][uVar10 >> 8 & 0xff];
      uVar15 = saes_table[0][uVar9 & 0xff];
      uVar16 = saes_table[1][uVar11 >> 8 & 0xff];
      uVar17 = saes_table[0][uVar10 & 0xff];
      uVar18 = saes_table[1][uVar8 >> 8 & 0xff];
      uVar19 = saes_table[0][uVar11 & 0xff];
      uVar20 = *(uint *)((long)saes_table[2] + (ulong)(uVar10 >> 0xe & 0x3fc));
      uVar21 = *(uint *)((long)saes_table[2] + (ulong)(uVar11 >> 0xe & 0x3fc));
      uVar22 = *(uint *)((long)saes_table[2] + (ulong)(uVar8 >> 0xe & 0x3fc));
      uVar23 = *(uint *)((long)saes_table[2] + (ulong)(uVar9 >> 0xe & 0x3fc));
      uVar11 = *(uint *)((long)saes_table[3] + (ulong)(uVar11 >> 0x16 & 0xfffffffc));
      uVar8 = *(uint *)((long)saes_table[3] + (ulong)(uVar8 >> 0x16 & 0xfffffffc));
      uVar9 = *(uint *)((long)saes_table[3] + (ulong)(uVar9 >> 0x16 & 0xfffffffc));
      uVar10 = *(uint *)((long)saes_table[3] + (ulong)(uVar10 >> 0x16 & 0xfffffffc));
      plVar1 = (long *)((long)*output_00 + (uVar37 ^ 0x30));
      lVar28 = plVar1[1];
      uVar51 = CONCAT44(saes_table[1][uVar6 >> 8 & 0xff] ^ saes_table[0][uVar5 & 0xff] ^
                        *(uint *)((long)saes_table[2] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                        *(uint *)((long)saes_table[3] + (ulong)(uVar4 >> 0x16 & 0xfffffffc)),
                        saes_table[1][uVar5 >> 8 & 0xff] ^ saes_table[0][uVar4 & 0xff] ^
                        *(uint *)((long)saes_table[2] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^
                        *(uint *)((long)saes_table[3] + (ulong)(uVar7 >> 0x16 & 0xfffffffc))) ^
               uVar60;
      uVar53 = CONCAT44(saes_table[1][uVar4 >> 8 & 0xff] ^ saes_table[0][uVar7 & 0xff] ^
                        *(uint *)((long)saes_table[2] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
                        *(uint *)((long)saes_table[3] + (ulong)(uVar6 >> 0x16 & 0xfffffffc)),
                        saes_table[1][uVar7 >> 8 & 0xff] ^ saes_table[0][uVar6 & 0xff] ^
                        *(uint *)((long)saes_table[2] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
                        *(uint *)((long)saes_table[3] + (ulong)(uVar5 >> 0x16 & 0xfffffffc))) ^
               uVar61;
      plVar2 = (long *)((long)*output_00 + (uVar37 ^ 0x10));
      lVar29 = *plVar2;
      lVar30 = plVar2[1];
      plVar2 = (long *)((long)*output_00 + (uVar37 ^ 0x20));
      lVar31 = *plVar2;
      lVar32 = plVar2[1];
      plVar2 = (long *)((long)*output_00 + (uVar37 ^ 0x10));
      *plVar2 = *plVar1 + uVar34;
      plVar2[1] = lVar28 + uVar43;
      plVar1 = (long *)((long)*output_00 + (uVar37 ^ 0x20));
      *plVar1 = lVar29 + uVar50;
      plVar1[1] = lVar30 + uVar52;
      uVar57 = CONCAT44(uVar14 ^ uVar15 ^ uVar21 ^ uVar8,uVar12 ^ uVar13 ^ uVar20 ^ uVar11) ^ uVar62
      ;
      uVar59 = CONCAT44(uVar18 ^ uVar19 ^ uVar23 ^ uVar10,uVar16 ^ uVar17 ^ uVar22 ^ uVar9) ^ uVar63
      ;
      plVar1 = (long *)((long)*output_00 + (uVar37 ^ 0x30));
      *plVar1 = lVar31 + uVar60;
      plVar1[1] = lVar32 + uVar61;
      puVar3 = (ulong *)((long)*output_00 + uVar37);
      *puVar3 = uVar51 ^ uVar50;
      puVar3[1] = uVar53 ^ uVar52;
      plVar1 = (long *)((long)*output_01 + (uVar39 ^ 0x30));
      lVar28 = plVar1[1];
      plVar2 = (long *)((long)*output_01 + (uVar39 ^ 0x10));
      lVar29 = *plVar2;
      lVar30 = plVar2[1];
      plVar2 = (long *)((long)*output_01 + (uVar39 ^ 0x20));
      lVar31 = *plVar2;
      lVar32 = plVar2[1];
      plVar2 = (long *)((long)*output_01 + (uVar39 ^ 0x10));
      *plVar2 = *plVar1 + uVar54;
      plVar2[1] = lVar28 + uVar55;
      uVar47 = uVar51 & 0xffff0;
      plVar1 = (long *)((long)*output_01 + (uVar39 ^ 0x20));
      *plVar1 = lVar29 + uVar56;
      plVar1[1] = lVar30 + uVar58;
      plVar1 = (long *)((long)*output_01 + (uVar39 ^ 0x30));
      *plVar1 = lVar31 + uVar62;
      plVar1[1] = lVar32 + uVar63;
      puVar3 = (ulong *)((long)*output_01 + uVar39);
      *puVar3 = uVar57 ^ uVar56;
      puVar3[1] = uVar59 ^ uVar58;
      uVar38 = lVar48 << 0x20 ^ uVar45 ^ *(ulong *)((long)*output_00 + uVar47);
      uVar45 = (ulong)((int)uVar51 + (int)lVar48 * 2 & 0x7ffffffe) | 0x80000001;
      uVar45 = uVar53 % uVar45 << 0x20 | uVar53 / uVar45 & 0xffffffff;
      dVar64 = SQRT((double)(uVar45 + uVar51 >> 0xc | 0x3ff0000000000000));
      uVar39 = (ulong)dVar64 >> 0x13;
      uVar37 = (ulong)dVar64 >> 0x14;
      lVar48 = uVar39 + (((uVar39 - uVar37) + -0x3fdffffffff) * (uVar37 - 0x3fe00000000) <
                        uVar45 + uVar51);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar38;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar51;
      uVar40 = SUB168(auVar24 * auVar26,8);
      uVar33 = SUB168(auVar24 * auVar26,0);
      puVar3 = (ulong *)((long)*output_00 + (uVar47 ^ 0x20));
      uVar39 = *puVar3;
      uVar35 = puVar3[1];
      plVar1 = (long *)((long)*output_00 + (uVar47 ^ 0x30));
      lVar28 = plVar1[1];
      puVar3 = (ulong *)((long)*output_00 + (uVar47 ^ 0x10));
      uVar41 = *puVar3;
      uVar42 = puVar3[1];
      uVar37 = *(ulong *)((long)*output_00 + uVar47 + 8);
      plVar2 = (long *)((long)*output_00 + (uVar47 ^ 0x10));
      *plVar2 = uVar34 + *plVar1;
      plVar2[1] = uVar43 + lVar28;
      uVar65 = (uVar39 ^ uVar40) + uVar60;
      uVar66 = (uVar35 ^ uVar33) + uVar61;
      uVar46 = uVar57 & 0xffff0;
      plVar1 = (long *)((long)*output_00 + (uVar47 ^ 0x20));
      *plVar1 = (uVar40 ^ uVar41) + uVar50;
      plVar1[1] = (uVar33 ^ uVar42) + uVar52;
      plVar1 = (long *)((long)*output_00 + (uVar47 ^ 0x30));
      *plVar1 = uVar39 + uVar60;
      plVar1[1] = uVar35 + uVar61;
      puVar3 = (ulong *)((long)*output_00 + uVar47);
      *puVar3 = uVar65;
      puVar3[1] = uVar66;
      uVar42 = lVar44 << 0x20 ^ uVar49 ^ *(ulong *)((long)*output_01 + uVar46);
      uVar49 = (ulong)((int)uVar57 + (int)lVar44 * 2 & 0x7ffffffe) | 0x80000001;
      uVar49 = uVar59 % uVar49 << 0x20 | uVar59 / uVar49 & 0xffffffff;
      dVar64 = SQRT((double)(uVar49 + uVar57 >> 0xc | 0x3ff0000000000000));
      uVar43 = (ulong)dVar64 >> 0x13;
      uVar34 = (ulong)dVar64 >> 0x14;
      lVar44 = uVar43 + (((uVar43 - uVar34) + -0x3fdffffffff) * (uVar34 - 0x3fe00000000) <
                        uVar49 + uVar57);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar42;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar57;
      uVar41 = SUB168(auVar25 * auVar27,8);
      uVar35 = SUB168(auVar25 * auVar27,0);
      puVar3 = (ulong *)((long)*output_01 + (uVar46 ^ 0x20));
      uVar43 = *puVar3;
      uVar60 = puVar3[1];
      puVar3 = (ulong *)((long)*output_01 + (uVar46 ^ 0x10));
      uVar61 = *puVar3;
      uVar39 = puVar3[1];
      uVar34 = *(ulong *)((long)*output_01 + uVar46 + 8);
      plVar1 = (long *)((long)*output_01 + (uVar46 ^ 0x30));
      lVar28 = plVar1[1];
      plVar2 = (long *)((long)*output_01 + (uVar46 ^ 0x10));
      *plVar2 = uVar54 + *plVar1;
      plVar2[1] = uVar55 + lVar28;
      plVar1 = (long *)((long)*output_01 + (uVar46 ^ 0x20));
      *plVar1 = (uVar41 ^ uVar61) + uVar56;
      plVar1[1] = (uVar35 ^ uVar39) + uVar58;
      plVar1 = (long *)((long)*output_01 + (uVar46 ^ 0x30));
      *plVar1 = uVar43 + uVar62;
      plVar1[1] = uVar60 + uVar63;
      uVar62 = (uVar43 ^ uVar41) + uVar62;
      uVar63 = (uVar60 ^ uVar35) + uVar63;
      puVar3 = (ulong *)((long)*output_01 + uVar46);
      *puVar3 = uVar62;
      puVar3[1] = uVar63;
      uVar60 = uVar38 ^ uVar65;
      uVar61 = uVar37 ^ uVar66;
      uVar62 = uVar42 ^ uVar62;
      uVar63 = uVar34 ^ uVar63;
      uVar36 = uVar36 - 1;
      uVar54 = uVar56;
      uVar55 = uVar58;
      uVar34 = uVar50;
      uVar43 = uVar52;
    } while (uVar36 != 0);
  }
  cn_implode_scratchpad<true>(output_00,(__m128i *)input_00);
  cn_implode_scratchpad<true>(output_01,(__m128i *)input_01);
  keccakf((uint64_t *)input_00,0x18);
  keccakf((uint64_t *)input_01,0x18);
  (*(code *)(&extra_hashes)[(byte)*(longlong *)input_00->state & 3])(input_00,200,output);
  hashval = output + 0x20;
  switch((byte)*(longlong *)input_01->state & 3) {
  case 0:
    blake256_hash(hashval,input_01->state,200);
    return;
  case 1:
    groestl(input_01->state,0x640,hashval);
    return;
  case 2:
    jh_hash(0x100,input_01->state,0x640,hashval);
    return;
  case 3:
    xmr_skein(input_01->state,hashval);
    return;
  }
}

Assistant:

inline void cryptonight_double_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    keccak(input,        size, ctx[0]->state);
    keccak(input + size, size, ctx[1]->state);

    uint8_t *l0  = ctx[0]->memory;
    uint8_t *l1  = ctx[1]->memory;
    uint64_t *h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t *h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);

    VARIANT2_INIT(0);
    VARIANT2_INIT(1);
    VARIANT2_SET_ROUNDING_MODE();

    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(h0), reinterpret_cast<__m128i *>(l0));
    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(h1), reinterpret_cast<__m128i *>(l1));

    uint64_t al0 = h0[0] ^ h0[4];
    uint64_t al1 = h1[0] ^ h1[4];
    uint64_t ah0 = h0[1] ^ h0[5];
    uint64_t ah1 = h1[1] ^ h1[5];

    __m128i bx00 = _mm_set_epi64x(h0[3] ^ h0[7], h0[2] ^ h0[6]);
    __m128i bx01 = _mm_set_epi64x(h0[9] ^ h0[11], h0[8] ^ h0[10]);
    __m128i bx10 = _mm_set_epi64x(h1[3] ^ h1[7], h1[2] ^ h1[6]);
    __m128i bx11 = _mm_set_epi64x(h1[9] ^ h1[11], h1[8] ^ h1[10]);

    uint64_t idx0 = al0;
    uint64_t idx1 = al1;

    for (size_t i = 0; i < iters; i++) {
        __m128i cx0, cx1;
        if (!SOFT_AES) {
            cx0 = _mm_load_si128(reinterpret_cast<const __m128i *>(&l0[idx0 & MASK]));
            cx1 = _mm_load_si128(reinterpret_cast<const __m128i *>(&l1[idx1 & MASK]));
        }

        const __m128i ax0 = _mm_set_epi64x(ah0, al0);
        const __m128i ax1 = _mm_set_epi64x(ah1, al1);
        if (SOFT_AES) {
            cx0 = soft_aesenc(&l0[idx0 & MASK], ax0, reinterpret_cast<const uint32_t*>(saes_table));
            cx1 = soft_aesenc(&l1[idx1 & MASK], ax1, reinterpret_cast<const uint32_t*>(saes_table));
        }
        else {
            cx0 = _mm_aesenc_si128(cx0, ax0);
            cx1 = _mm_aesenc_si128(cx1, ax1);
        }

        cryptonight_monero_tweak((uint64_t*)&l0[idx0 & MASK], l0, idx0 & MASK, ax0, bx00, bx01, cx0);
        cryptonight_monero_tweak((uint64_t*)&l1[idx1 & MASK], l1, idx1 & MASK, ax1, bx10, bx11, cx1);

        idx0 = _mm_cvtsi128_si64(cx0);
        idx1 = _mm_cvtsi128_si64(cx1);

        uint64_t hi, lo, cl, ch;
        cl = ((uint64_t*) &l0[idx0 & MASK])[0];
        ch = ((uint64_t*) &l0[idx0 & MASK])[1];

        VARIANT2_INTEGER_MATH(0, cl, cx0);

        lo = __umul128(idx0, cl, &hi);

        VARIANT2_SHUFFLE2(l0, idx0 & MASK, ax0, bx00, bx01, hi, lo, 0);

        al0 += hi;
        ah0 += lo;

        ((uint64_t*)&l0[idx0 & MASK])[0] = al0;
        ((uint64_t*) &l0[idx0 & MASK])[1] = ah0;

        al0 ^= cl;
        ah0 ^= ch;
        idx0 = al0;

        cl = ((uint64_t*) &l1[idx1 & MASK])[0];
        ch = ((uint64_t*) &l1[idx1 & MASK])[1];

        VARIANT2_INTEGER_MATH(1, cl, cx1);

        lo = __umul128(idx1, cl, &hi);

        VARIANT2_SHUFFLE2(l1, idx1 & MASK, ax1, bx10, bx11, hi, lo, 0);

        al1 += hi;
        ah1 += lo;

        ((uint64_t*)&l1[idx1 & MASK])[0] = al1;
        ((uint64_t*)&l1[idx1 & MASK])[1] = ah1;

        al1 ^= cl;
        ah1 ^= ch;
        idx1 = al1;

        bx01 = bx00;
        bx11 = bx10;

        bx00 = cx0;
        bx10 = cx1;
    }

    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(l0), reinterpret_cast<__m128i *>(h0));
    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(l1), reinterpret_cast<__m128i *>(h1));

    keccakf(h0, 24);
    keccakf(h1, 24);

    extra_hashes[ctx[0]->state[0] & 3](ctx[0]->state, 200, output);
    extra_hashes[ctx[1]->state[0] & 3](ctx[1]->state, 200, output + 32);
}